

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

AssertionResult __thiscall testing::AssertionFailure(testing *this,Message *message)

{
  AssertionResult *other;
  scoped_ptr<testing::internal::String> extraout_RDX;
  AssertionResult AVar1;
  AssertionResult local_28;
  Message *local_18;
  Message *message_local;
  
  local_18 = message;
  message_local = (Message *)this;
  AssertionFailure();
  other = AssertionResult::operator<<(&local_28,local_18);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  AssertionResult::~AssertionResult(&local_28);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult AssertionFailure(const Message& message) {
  return AssertionFailure() << message;
}